

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  int iVar1;
  size_t sVar2;
  LodePNGColorMode *in_RCX;
  LodePNGColorMode *in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uchar a_1;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *p;
  size_t numbytes_1;
  size_t palsize;
  uchar *palette;
  size_t palettesize;
  size_t numbytes;
  uint error;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  LodePNGColorMode *in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffee0;
  uchar in_stack_fffffffffffffee4;
  uchar in_stack_fffffffffffffee5;
  uchar in_stack_fffffffffffffee6;
  uchar in_stack_fffffffffffffee7;
  ColorTree *in_stack_fffffffffffffee8;
  unsigned_short in_stack_fffffffffffffef8;
  unsigned_short a_00;
  unsigned_short in_stack_fffffffffffffefa;
  unsigned_short b_00;
  unsigned_short in_stack_fffffffffffffefc;
  unsigned_short g_00;
  uchar in_stack_fffffffffffffefe;
  undefined1 uVar3;
  uchar in_stack_fffffffffffffeff;
  undefined1 uVar4;
  ColorTree *in_stack_ffffffffffffff00;
  LodePNGColorMode *in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff10;
  uchar *in_stack_ffffffffffffff18;
  uchar *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  uchar *local_38;
  uint local_4;
  
  sVar2 = (ulong)in_R8D * (ulong)in_R9D;
  local_4 = 0;
  if ((in_RCX->colortype == LCT_PALETTE) && (in_RCX->palette == (uchar *)0x0)) {
    local_4 = 0x6b;
  }
  else {
    iVar1 = lodepng_color_mode_equal(in_RDX,in_RCX);
    if (iVar1 == 0) {
      if (in_RDX->colortype == LCT_PALETTE) {
        in_stack_ffffffffffffff20 = (uchar *)in_RDX->palettesize;
        in_stack_ffffffffffffff18 = in_RDX->palette;
        in_stack_ffffffffffffff10 = (uchar *)(1L << ((byte)in_RDX->bitdepth & 0x3f));
        if (in_stack_ffffffffffffff20 == (uchar *)0x0) {
          in_stack_ffffffffffffff20 = (uchar *)in_RCX->palettesize;
          in_stack_ffffffffffffff18 = in_RCX->palette;
          if ((in_RCX->colortype == LCT_PALETTE) && (in_RCX->bitdepth == in_RDX->bitdepth)) {
            sVar2 = lodepng_get_raw_size
                              (CONCAT13(in_stack_fffffffffffffee7,
                                        CONCAT12(in_stack_fffffffffffffee6,
                                                 CONCAT11(in_stack_fffffffffffffee5,
                                                          in_stack_fffffffffffffee4))),
                               in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            lodepng_memcpy(in_RDI,in_RSI,sVar2);
            return 0;
          }
        }
        if (in_stack_ffffffffffffff20 < in_stack_ffffffffffffff10) {
          in_stack_ffffffffffffff10 = in_stack_ffffffffffffff20;
        }
        color_tree_init((ColorTree *)0xad5132);
        for (local_38 = (uchar *)0x0; local_38 != in_stack_ffffffffffffff10; local_38 = local_38 + 1
            ) {
          in_stack_ffffffffffffff00 = (ColorTree *)(in_stack_ffffffffffffff18 + (long)local_38 * 4);
          local_4 = color_tree_add(in_stack_fffffffffffffee8,in_stack_fffffffffffffee7,
                                   in_stack_fffffffffffffee6,in_stack_fffffffffffffee5,
                                   in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
          if (local_4 != 0) break;
        }
      }
      if (local_4 == 0) {
        if ((in_RCX->bitdepth == 0x10) && (in_RDX->bitdepth == 0x10)) {
          for (local_38 = (uchar *)0x0; local_38 != (uchar *)sVar2;
              local_38 = (uchar *)((long)local_38 + 1)) {
            uVar3 = 0;
            uVar4 = 0;
            g_00 = 0;
            b_00 = 0;
            a_00 = 0;
            getPixelColorRGBA16((unsigned_short *)&stack0xfffffffffffffefe,
                                (unsigned_short *)&stack0xfffffffffffffefc,
                                (unsigned_short *)&stack0xfffffffffffffefa,
                                (unsigned_short *)&stack0xfffffffffffffef8,in_RSI,(size_t)local_38,
                                in_RCX);
            rgba16ToPixel(in_RDI,(size_t)local_38,in_RDX,CONCAT11(uVar4,uVar3),g_00,b_00,a_00);
          }
        }
        else if ((in_RDX->bitdepth == 8) && (in_RDX->colortype == LCT_RGBA)) {
          getPixelColorsRGBA8(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                              in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        else if ((in_RDX->bitdepth == 8) && (in_RDX->colortype == LCT_RGB)) {
          getPixelColorsRGB8(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        else {
          for (local_38 = (uchar *)0x0; local_38 != (uchar *)sVar2;
              local_38 = (uchar *)((long)local_38 + 1)) {
            getPixelColorRGBA8(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                               in_stack_ffffffffffffff10,(uchar *)in_stack_ffffffffffffff08,
                               (uchar *)in_stack_ffffffffffffff00,
                               CONCAT17(in_stack_fffffffffffffeff,
                                        CONCAT16(in_stack_fffffffffffffefe,
                                                 CONCAT24(in_stack_fffffffffffffefc,
                                                          CONCAT22(in_stack_fffffffffffffefa,
                                                                   in_stack_fffffffffffffef8)))),
                               (LodePNGColorMode *)CONCAT44(local_4,in_stack_ffffffffffffff30));
            in_stack_fffffffffffffee0 = 0;
            local_4 = rgba8ToPixel(in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                                   in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffeff,in_stack_fffffffffffffefe,
                                   (uchar)in_stack_ffffffffffffff30,(uchar)sVar2);
            if (local_4 != 0) break;
          }
        }
      }
      if (in_RDX->colortype == LCT_PALETTE) {
        color_tree_cleanup((ColorTree *)
                           CONCAT17(in_stack_fffffffffffffee7,
                                    CONCAT16(in_stack_fffffffffffffee6,
                                             CONCAT15(in_stack_fffffffffffffee5,
                                                      CONCAT14(in_stack_fffffffffffffee4,
                                                               in_stack_fffffffffffffee0)))));
      }
    }
    else {
      sVar2 = lodepng_get_raw_size
                        (CONCAT13(in_stack_fffffffffffffee7,
                                  CONCAT12(in_stack_fffffffffffffee6,
                                           CONCAT11(in_stack_fffffffffffffee5,
                                                    in_stack_fffffffffffffee4))),
                         in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      lodepng_memcpy(in_RDI,in_RSI,sVar2);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  if(mode_in->colortype == LCT_PALETTE && !mode_in->palette) {
    return 107; /* error: must provide palette if input mode is palette */
  }

  if(lodepng_color_mode_equal(mode_out, mode_in)) {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    lodepng_memcpy(out, in, numbytes);
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE) {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = (size_t)1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0) {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
      /*if the input was also palette with same bitdepth, then the color types are also
      equal, so copy literally. This to preserve the exact indices that were in the PNG
      even in case there are duplicate colors in the palette.*/
      if(mode_in->colortype == LCT_PALETTE && mode_in->bitdepth == mode_out->bitdepth) {
        size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
        lodepng_memcpy(out, in, numbytes);
        return 0;
      }
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i) {
      const unsigned char* p = &palette[i * 4];
      error = color_tree_add(&tree, p[0], p[1], p[2], p[3], (unsigned)i);
      if(error) break;
    }
  }

  if(!error) {
    if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i) {
        unsigned short r = 0, g = 0, b = 0, a = 0;
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        rgba16ToPixel(out, i, mode_out, r, g, b, a);
      }
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA) {
      getPixelColorsRGBA8(out, numpixels, in, mode_in);
    } else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB) {
      getPixelColorsRGB8(out, numpixels, in, mode_in);
    } else {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        error = rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
        if(error) break;
      }
    }
  }

  if(mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }

  return error;
}